

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

Expression * __thiscall hdc::Parser::parse_term_expression(Parser *this)

{
  Token *pTVar1;
  bool bVar2;
  Expression *left;
  Expression *pEVar3;
  Expression *pEVar4;
  Token oper;
  undefined1 local_60 [16];
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_50._M_p = (pointer)&local_40;
  left = parse_bitwise_or_expression(this);
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          bVar2 = match(this,TK_TIMES);
          if (!bVar2) break;
          pTVar1 = (this->matched)._M_current;
          local_60._8_4_ = pTVar1->column;
          local_60._0_4_ = pTVar1->kind;
          local_60._4_4_ = pTVar1->line;
          std::__cxx11::string::_M_assign((string *)&local_50);
          pEVar3 = (Expression *)operator_new(0x68);
          pEVar4 = parse_bitwise_or_expression(this);
          TimesExpression::TimesExpression((TimesExpression *)pEVar3,(Token *)local_60,left,pEVar4);
          left = pEVar3;
        }
        bVar2 = match(this,TK_DIVISION);
        if (!bVar2) break;
        pTVar1 = (this->matched)._M_current;
        local_60._8_4_ = pTVar1->column;
        local_60._0_4_ = pTVar1->kind;
        local_60._4_4_ = pTVar1->line;
        std::__cxx11::string::_M_assign((string *)&local_50);
        pEVar3 = (Expression *)operator_new(0x68);
        pEVar4 = parse_bitwise_or_expression(this);
        DivisionExpression::DivisionExpression
                  ((DivisionExpression *)pEVar3,(Token *)local_60,left,pEVar4);
        left = pEVar3;
      }
      bVar2 = match(this,TK_INTEGER_DIVISION);
      if (!bVar2) break;
      pTVar1 = (this->matched)._M_current;
      local_60._8_4_ = pTVar1->column;
      local_60._0_4_ = pTVar1->kind;
      local_60._4_4_ = pTVar1->line;
      std::__cxx11::string::_M_assign((string *)&local_50);
      pEVar3 = (Expression *)operator_new(0x68);
      pEVar4 = parse_bitwise_or_expression(this);
      IntegerDivisionExpression::IntegerDivisionExpression
                ((IntegerDivisionExpression *)pEVar3,(Token *)local_60,left,pEVar4);
      left = pEVar3;
    }
    bVar2 = match(this,TK_MODULO);
    if (!bVar2) break;
    pTVar1 = (this->matched)._M_current;
    local_60._8_4_ = pTVar1->column;
    local_60._0_4_ = pTVar1->kind;
    local_60._4_4_ = pTVar1->line;
    std::__cxx11::string::_M_assign((string *)&local_50);
    pEVar3 = (Expression *)operator_new(0x68);
    pEVar4 = parse_bitwise_or_expression(this);
    ModuloExpression::ModuloExpression((ModuloExpression *)pEVar3,(Token *)local_60,left,pEVar4);
    left = pEVar3;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_p != &local_40) {
    operator_delete(local_50._M_p);
  }
  return left;
}

Assistant:

Expression* Parser::parse_term_expression() {
    Token oper;
    Expression* expression = parse_bitwise_or_expression();

    while (true) {
        if (match(TK_TIMES)) {
            oper = *matched;
            expression = new TimesExpression(oper, expression, parse_bitwise_or_expression());
        } else if (match(TK_DIVISION)) {
            oper = *matched;
            expression = new DivisionExpression(oper, expression, parse_bitwise_or_expression());
        } else if (match(TK_INTEGER_DIVISION)) {
            oper = *matched;
            expression = new IntegerDivisionExpression(oper, expression, parse_bitwise_or_expression());
        } else if (match(TK_MODULO)) {
            oper = *matched;
            expression = new ModuloExpression(oper, expression, parse_bitwise_or_expression());
        } else {
            break;
        }
    }

    return expression;
}